

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O3

Vec_Int_t * Gia_GlaConvertToFla(Gia_Man_t *p,Vec_Int_t *vGla)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar1 = p->nRegs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nCap = uVar3;
  if (uVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
    pVVar4->pArray = __s;
    pVVar4->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_00629f2a;
    }
  }
  __s = (int *)0x0;
LAB_00629f2a:
  if (0 < (int)uVar1) {
    pVVar2 = p->vCis;
    uVar5 = 0;
    do {
      uVar3 = pVVar2->nSize;
      uVar7 = -uVar1 + uVar5 + (ulong)uVar3;
      iVar6 = (int)uVar7;
      if ((iVar6 < 0) || ((int)uVar3 <= iVar6)) {
LAB_00629fb8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar2->pArray[uVar7 & 0xffffffff];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar4;
      }
      if (vGla->nSize <= iVar6) goto LAB_00629fb8;
      if (vGla->pArray[iVar6] != 0) {
        if (uVar1 <= uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar5] = 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar1);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_GlaConvertToFla( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Vec_Int_t * vFla;
    Gia_Obj_t * pObj;
    int i;
    vFla = Vec_IntStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Vec_IntWriteEntry( vFla, i, 1 );
    return vFla;
}